

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

void dump_mrd(void *mrdv)

{
  ulong uVar1;
  response_spec *mrd;
  
  uVar1 = (ulong)*mrdv;
  if (uVar1 < 4) {
    printf(&DAT_0014feec + *(int *)(&DAT_0014feec + uVar1 * 4),
           *(undefined8 *)((long)mrdv + *(long *)(&DAT_00150f60 + uVar1 * 8)));
    return;
  }
  return;
}

Assistant:

void
dump_mrd(void *mrdv)
{
    struct response_spec *mrd = (struct response_spec *) mrdv;
    switch (mrd->response_type) {
    case Response_Filter:
	printf("Response Filter, code is %s\n",
	       mrd->u.filter.function);
	break;
    case Response_Router:
	printf("Response Router, code is %s\n",
	       mrd->u.filter.function);
	break;
    case Response_Transform:
	printf("Response Transform, code is %s\n",
	       mrd->u.transform.function);
	break;
    case Response_Multityped:
	printf("Multityped Action, code is %s\n",
	       mrd->u.transform.function);
	break;
    }
}